

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

real __thiscall fasttext::Vector::norm(Vector *this)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar2 = (this->data_).size_;
  auVar5 = ZEXT816(0) << 0x40;
  uVar3 = 0;
  while ((~((long)uVar2 >> 0x3f) & uVar2) != uVar3) {
    pfVar1 = (this->data_).mem_ + uVar3;
    uVar3 = uVar3 + 1;
    auVar6 = ZEXT416((uint)*pfVar1);
    auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
  }
  if (0.0 <= auVar5._0_4_) {
    auVar5 = vsqrtss_avx(auVar5,auVar5);
    return auVar5._0_4_;
  }
  fVar4 = sqrtf(auVar5._0_4_);
  return fVar4;
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}